

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCas<(moira::Instr)143,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  Ea<(moira::Mode)8,_2> dst;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  iVar4 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar5 & 0xffff | iVar4 << 0x10;
  if (((uVar3 & 0xfe38) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)143,(moira::Mode)8,2>(this,str,addr,op);
    return;
  }
  cVar8 = 'c';
  lVar6 = 1;
  do {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = cVar8;
    cVar8 = "cas"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pcVar7 = str->ptr;
  SVar2 = str->style->syntax;
  str->ptr = pcVar7 + 1;
  if (2 < SVar2 - MOIRA_MIT) {
    *pcVar7 = '.';
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
  }
  *pcVar7 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  else {
    iVar4 = (str->tab).raw;
    pcVar7 = str->ptr;
    do {
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      pcVar7 = str->ptr;
    } while (pcVar7 < str->base + iVar4);
  }
  StrWriter::operator<<(str,(Dn)(uVar3 & 7));
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  StrWriter::operator<<(str,(Dn)((uVar3 & 0xffff) >> 6 & 7));
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar8 = ';';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "trap%-2s  ; (2+)"[lVar6 + 10];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmCas(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto dc  = Dn ( _____________xxx(ext) );
    auto du  = Dn ( _______xxx______(ext) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << dc << Sep{} << du << Sep{} << dst;
    str << Av<I, M, S>{};
}